

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O3

int __thiscall CGL::CameraApertureTexture::init(CameraApertureTexture *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  iterator __position;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  ostream *poVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  uint uVar10;
  char *in_RDX;
  _Self __tmp;
  uint uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uchar curr_texel;
  uint height;
  uint width;
  vector<unsigned_char,_std::allocator<unsigned_char>_> texels;
  set<float,_std::greater<float>,_std::allocator<float>_> unique;
  string absolute_path;
  uchar local_a1;
  uint local_a0;
  uint local_9c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  _Rb_tree<float,_float,_std::_Identity<float>,_std::greater<float>,_std::allocator<float>_>
  local_80;
  string local_50;
  
  this->width = 0;
  this->height = 0;
  resolve_path_abi_cxx11_(&local_50,*(CGL **)ctx,in_RDX);
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = lodepng::decode(&local_98,&local_9c,&local_a0,&local_50,LCT_RGBA,8);
  if (uVar7 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Loaded Aperture Function with (W, H): (",0x27);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,")\n",2);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"UNABLE TO LOAD APERTURE FUNCTION",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
  }
  this->width = (ulong)local_9c;
  this->height = (ulong)local_a0;
  std::vector<float,_std::allocator<float>_>::reserve(&this->aperture,(ulong)(local_a0 * local_9c));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of Pixels to Process: ",0x1d);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  this->min_y = local_9c;
  this->min_x = local_9c;
  this->max_x = -1;
  this->max_y = -1;
  this->total_value = 0.0;
  if (local_a0 != 0) {
    uVar11 = 0;
    uVar7 = local_9c;
    uVar10 = local_a0;
    do {
      uVar6 = 0;
      if (uVar7 != 0) {
        uVar12 = 0;
        do {
          local_a1 = local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[(uVar7 * uVar11 + uVar12) * 4];
          Color::Color((Color *)&local_80,&local_a1);
          __position._M_current =
               (this->aperture).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->aperture).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&this->aperture,__position,
                       (float *)&local_80);
          }
          else {
            *__position._M_current = (float)local_80._M_impl._0_4_;
            (this->aperture).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          this->total_value = (double)(float)local_80._M_impl._0_4_ + this->total_value;
          if (0.0 < (float)local_80._M_impl._0_4_) {
            uVar1 = this->min_x;
            uVar3 = this->min_y;
            auVar13._4_4_ = uVar3;
            auVar13._0_4_ = uVar1;
            auVar5 = vpinsrd_avx(ZEXT416(uVar12),uVar11,1);
            auVar13._8_8_ = 0;
            auVar13 = vpminsd_avx(auVar13,auVar5);
            uVar2 = this->max_x;
            uVar4 = this->max_y;
            auVar14._4_4_ = uVar4;
            auVar14._0_4_ = uVar2;
            auVar14._8_8_ = 0;
            auVar5 = vpmaxsd_avx(auVar5,auVar14);
            auVar5 = vpunpcklqdq_avx(auVar13,auVar5);
            this->min_x = auVar5._0_4_;
            this->min_y = auVar5._4_4_;
            this->max_x = auVar5._8_4_;
            this->max_y = auVar5._12_4_;
          }
          uVar12 = uVar12 + 1;
          uVar7 = local_9c;
          uVar10 = local_a0;
          uVar6 = local_9c;
        } while (uVar12 < local_9c);
      }
      uVar7 = uVar6;
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Bounding Box (x1,y1) - (x2,y2): (",0x21);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->min_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,this->min_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,") - (",5);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,this->max_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,this->max_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,")\n",2);
  std::set<float,std::greater<float>,std::allocator<float>>::
  set<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
            ((set<float,std::greater<float>,std::allocator<float>> *)&local_80,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             (this->aperture).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             (this->aperture).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish);
  for (; (_Rb_tree_header *)local_80._M_impl.super__Rb_tree_header._M_header._M_left !=
         &local_80._M_impl.super__Rb_tree_header;
      local_80._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment(local_80._M_impl.super__Rb_tree_header._M_header._M_left)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Found unique value: ",0x14);
    poVar8 = std::ostream::_M_insert<double>
                       ((double)(float)local_80._M_impl.super__Rb_tree_header._M_header._M_left[1].
                                       _M_color);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  std::_Rb_tree<float,_float,_std::_Identity<float>,_std::greater<float>,_std::allocator<float>_>::
  ~_Rb_tree(&local_80);
  if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  paVar9 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar9) {
    operator_delete(local_50._M_dataplus._M_p);
    paVar9 = extraout_RAX;
  }
  return (int)paVar9;
}

Assistant:

void init(std::string aperture_filename) {
      width = 0;
      height = 0;

      /*
       * Process the pixels, capture values (need to experiment with the values it should take)
       */
      const char* file = aperture_filename.c_str();
      string absolute_path = resolve_path(file);

      vector<unsigned char> texels;
      unsigned int width, height;

      int response = lodepng::decode(texels, width, height, absolute_path);
      if (response) {
        cout << "UNABLE TO LOAD APERTURE FUNCTION" << endl;
      } else {
        cout << "Loaded Aperture Function with (W, H): (" << width << ", " << height << ")\n";
      }

      this->width = width;
      this->height = height;
      aperture.reserve(width * height);

      // Only Capture the Red Channel (Aperture Function is in Grayscale)
      cout << "Number of Pixels to Process: " << texels.size() << endl;

      // Channel = 0
      min_x = min_y = width;
      max_x = max_y = -1;
      total_value = 0.0;
      for (int y = 0; y < height; y++) {
        for (int x = 0; x < width; x++) {
          unsigned char curr_texel = texels[4 * (y * width + x)];
          Color curr_color = Color(&curr_texel);
          aperture.push_back(curr_color.r);
          total_value += curr_color.r;

          if (curr_color.r > 0) {
            min_x = min(x, min_x);
            min_y = min(y, min_y);

            max_x = max(x, max_x);
            max_y = max(y, max_y);
          }
        }
      }

      cout << "Bounding Box (x1,y1) - (x2,y2): (" << min_x << ", " << min_y
        << ") - (" << max_x << ", " << max_y << ")\n";

      // Debug Stuff
      set<float, greater<float>> unique(aperture.begin(), aperture.end());
      for (auto uitr = unique.begin(); uitr != unique.end(); uitr++) {
        cout << "Found unique value: " << *uitr << endl;
      }

    }